

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O3

int av1_get_shear_params(WarpedMotionParams *wm)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ushort uVar13;
  ushort uVar14;
  int32_t *mat;
  short sVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  short sVar20;
  
  uVar16 = wm->wmmat[2];
  if (0 < (int)uVar16) {
    uVar3 = 0x17fff;
    if (uVar16 < 0x17fff) {
      uVar3 = uVar16;
    }
    sVar15 = -0x8000;
    if (0x8000 < uVar3) {
      sVar15 = (short)uVar3;
    }
    iVar1 = wm->wmmat[3];
    iVar17 = 0x7fff;
    if (iVar1 < 0x7fff) {
      iVar17 = iVar1;
    }
    iVar9 = -0x8000;
    if (-0x8000 < iVar17) {
      iVar9 = iVar17;
    }
    uVar3 = 0x1f;
    if (uVar16 != 0) {
      for (; uVar16 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar6 = (byte)uVar3;
    iVar17 = (-1 << (bVar6 & 0x1f)) + uVar16;
    if (uVar3 < 9) {
      iVar17 = iVar17 << (8 - bVar6 & 0x1f);
    }
    else {
      bVar5 = 0x17 - (bVar6 ^ 0x1f);
      iVar17 = (int)(iVar17 + ((uint)(1 << (bVar5 & 0x1f)) >> 1)) >> (bVar5 & 0x1f);
    }
    bVar6 = bVar6 + 0xe;
    lVar11 = (long)wm->wmmat[4] * (long)(short)div_lut[iVar17];
    lVar12 = lVar11 * 0x10000;
    uVar19 = (ulong)(1L << (bVar6 & 0x3f)) >> 1;
    if (lVar12 < 0) {
      iVar18 = -(int)((long)(uVar19 + lVar11 * -0x10000) >> (bVar6 & 0x3f));
    }
    else {
      iVar18 = (int)(lVar12 + uVar19 >> (bVar6 & 0x3f));
    }
    iVar10 = 0x7fff;
    if (iVar18 < 0x7fff) {
      iVar10 = iVar18;
    }
    iVar4 = -0x8000;
    if (-0x8000 < iVar10) {
      iVar4 = iVar10;
    }
    lVar11 = (long)(short)div_lut[iVar17] * (long)iVar1 * (long)wm->wmmat[4];
    uVar19 = (ulong)(1L << (bVar6 & 0x3f)) >> 1;
    if (lVar11 < 0) {
      iVar17 = -(int)((long)(uVar19 - lVar11) >> (bVar6 & 0x3f));
    }
    else {
      iVar17 = (int)(lVar11 + uVar19 >> (bVar6 & 0x3f));
    }
    iVar17 = wm->wmmat[5] - iVar17;
    if (0x17ffe < iVar17) {
      iVar17 = 0x17fff;
    }
    sVar20 = -0x8000;
    if (0x8000 < iVar17) {
      sVar20 = (short)iVar17;
    }
    if (sVar15 < 0) {
      uVar16 = -(0x20U - (int)sVar15 >> 6);
    }
    else {
      uVar16 = (int)sVar15 + 0x20U >> 6;
    }
    uVar7 = (ushort)(uVar16 << 6);
    wm->alpha = uVar7;
    if (iVar1 < 0) {
      uVar16 = -(0x20U - iVar9 >> 6);
    }
    else {
      uVar16 = iVar9 + 0x20U >> 6;
    }
    uVar13 = (ushort)(uVar16 << 6);
    wm->beta = uVar13;
    if (iVar18 < 0) {
      uVar16 = -(0x20U - iVar4 >> 6);
    }
    else {
      uVar16 = iVar4 + 0x20U >> 6;
    }
    uVar8 = (ushort)(uVar16 << 6);
    wm->gamma = uVar8;
    if (sVar20 < 0) {
      uVar16 = -(0x20U - (int)sVar20 >> 6);
    }
    else {
      uVar16 = (int)sVar20 + 0x20U >> 6;
    }
    uVar2 = (ushort)(uVar16 << 6);
    wm->delta = uVar2;
    uVar14 = -uVar7;
    if (0 < (short)uVar7) {
      uVar14 = uVar7;
    }
    uVar7 = -uVar13;
    if (0 < (short)uVar13) {
      uVar7 = uVar13;
    }
    if (((uint)uVar7 * 8 - (uint)uVar7) + (uint)uVar14 * 4 < 0x10000) {
      uVar7 = -uVar8;
      if (0 < (short)uVar8) {
        uVar7 = uVar8;
      }
      uVar13 = -uVar2;
      if (0 < (short)uVar2) {
        uVar13 = uVar2;
      }
      if ((uint)uVar13 + (uint)uVar7 < 0x4000) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int av1_get_shear_params(WarpedMotionParams *wm) {
#ifndef NDEBUG
  // Check that models have been constructed sensibly
  // This is a good place to check, because this function does not need to
  // be called until after model construction is complete, but must be called
  // before the model can be used for prediction.
  check_model_consistency(wm);
#endif  // NDEBUG

  const int32_t *mat = wm->wmmat;
  if (!is_affine_valid(wm)) return 0;

  wm->alpha =
      clamp(mat[2] - (1 << WARPEDMODEL_PREC_BITS), INT16_MIN, INT16_MAX);
  wm->beta = clamp(mat[3], INT16_MIN, INT16_MAX);
  int16_t shift;
  int16_t y = resolve_divisor_32(abs(mat[2]), &shift) * (mat[2] < 0 ? -1 : 1);
  int64_t v = ((int64_t)mat[4] * (1 << WARPEDMODEL_PREC_BITS)) * y;
  wm->gamma =
      clamp((int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift), INT16_MIN, INT16_MAX);
  v = ((int64_t)mat[3] * mat[4]) * y;
  wm->delta = clamp(mat[5] - (int)ROUND_POWER_OF_TWO_SIGNED_64(v, shift) -
                        (1 << WARPEDMODEL_PREC_BITS),
                    INT16_MIN, INT16_MAX);

  wm->alpha = ROUND_POWER_OF_TWO_SIGNED(wm->alpha, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->beta = ROUND_POWER_OF_TWO_SIGNED(wm->beta, WARP_PARAM_REDUCE_BITS) *
             (1 << WARP_PARAM_REDUCE_BITS);
  wm->gamma = ROUND_POWER_OF_TWO_SIGNED(wm->gamma, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);
  wm->delta = ROUND_POWER_OF_TWO_SIGNED(wm->delta, WARP_PARAM_REDUCE_BITS) *
              (1 << WARP_PARAM_REDUCE_BITS);

  if (!is_affine_shear_allowed(wm->alpha, wm->beta, wm->gamma, wm->delta))
    return 0;

  return 1;
}